

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

Test * BuildTestMissingInput::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x4b8);
  BuildTestMissingInput((BuildTestMissingInput *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(BuildTest, MissingInput) {
  // Input is referenced by build file, but no rule for it.
  string err;
  Dirty("in1");
  EXPECT_FALSE(builder_.AddTarget("cat1", &err));
  EXPECT_EQ("'in1', needed by 'cat1', missing and no known rule to make it",
            err);
}